

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

value * __thiscall
mjs::interpreter::impl::operator()
          (value *__return_storage_ptr__,impl *this,array_literal_expression *e)

{
  gc_heap *pgVar1;
  bool bVar2;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  *this_00;
  ulong uVar3;
  size_type sVar4;
  unique_ptr *this_01;
  const_reference this_02;
  type e_00;
  object *poVar5;
  uint32_t index;
  uint32_t index_00;
  wstring_view wVar6;
  wstring local_118;
  wstring_view local_f8;
  string local_e8;
  wstring local_d8;
  wstring_view local_b8;
  string local_a8;
  value local_98;
  undefined1 local_70 [8];
  value val;
  uint i;
  vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
  *es;
  object_ptr a;
  array_literal_expression *e_local;
  impl *this_local;
  
  a.super_gc_heap_ptr_untyped._8_8_ = e;
  make_array((mjs *)&es,&this->global_,0);
  this_00 = array_literal_expression::elements
                      ((array_literal_expression *)a.super_gc_heap_ptr_untyped._8_8_);
  val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ = 0
  ;
  while( true ) {
    uVar3 = (ulong)val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                   super_gc_heap_ptr_untyped.pos_;
    sVar4 = std::
            vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
            ::size(this_00);
    if (sVar4 <= uVar3) break;
    this_01 = (unique_ptr *)
              std::
              vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
              ::operator[](this_00,(ulong)val.field_1.r_.property_name_.
                                          super_gc_heap_ptr<mjs::gc_string>.
                                          super_gc_heap_ptr_untyped.pos_);
    bVar2 = std::unique_ptr::operator_cast_to_bool(this_01);
    if (bVar2) {
      this_02 = std::
                vector<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>,_std::allocator<std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>_>_>
                ::operator[](this_00,(ulong)val.field_1.r_.property_name_.
                                            super_gc_heap_ptr<mjs::gc_string>.
                                            super_gc_heap_ptr_untyped.pos_);
      e_00 = std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::operator*
                       (this_02);
      eval(&local_98,this,e_00);
      get_value((value *)local_70,this,&local_98);
      value::~value(&local_98);
      poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)&es);
      pgVar1 = this->heap_;
      index_string_abi_cxx11_
                (&local_d8,
                 (mjs *)(ulong)val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_,index);
      wVar6 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_d8);
      local_b8 = wVar6;
      string::string(&local_a8,pgVar1,&local_b8);
      (*poVar5->_vptr_object[1])(poVar5,&local_a8,local_70,0);
      string::~string(&local_a8);
      std::__cxx11::wstring::~wstring((wstring *)&local_d8);
      value::~value((value *)local_70);
    }
    else {
      poVar5 = gc_heap_ptr<mjs::object>::operator->((gc_heap_ptr<mjs::object> *)&es);
      pgVar1 = this->heap_;
      index_string_abi_cxx11_
                (&local_118,
                 (mjs *)(ulong)val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
                               super_gc_heap_ptr_untyped.pos_,index_00);
      wVar6 = (wstring_view)
              std::__cxx11::wstring::operator_cast_to_basic_string_view((wstring *)&local_118);
      local_f8 = wVar6;
      string::string(&local_e8,pgVar1,&local_f8);
      (*poVar5->_vptr_object[1])(poVar5,&local_e8,value::undefined,0);
      string::~string(&local_e8);
      std::__cxx11::wstring::~wstring((wstring *)&local_118);
    }
    val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_ =
         val.field_1.r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
         pos_ + 1;
  }
  value::value(__return_storage_ptr__,(object_ptr *)&es);
  gc_heap_ptr<mjs::object>::~gc_heap_ptr((gc_heap_ptr<mjs::object> *)&es);
  return __return_storage_ptr__;
}

Assistant:

value operator()(const array_literal_expression& e) {
        auto a = make_array(global_, 0);
        const auto& es = e.elements();
        for (unsigned i = 0; i < es.size(); ++i) {
            if (es[i]) {
                auto val = get_value(eval(*es[i]));
                a->put(string{heap_, index_string(i)}, val);
            } else {
                a->put(string{heap_, index_string(i)}, value::undefined);
            }
        }
        return value{a};
    }